

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::RegisterGenerator
          (CommandLineInterface *this,string *flag_name,CodeGenerator *generator,string *help_text)

{
  mapped_type *this_00;
  GeneratorInfo info;
  undefined1 local_88 [72];
  _Alloc_hider local_40;
  size_type local_38;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_30;
  
  local_88._0_8_ = local_88 + 0x10;
  local_88._8_8_ = 0;
  local_88[0x10] = '\0';
  local_88._32_8_ = local_88 + 0x30;
  local_88._40_8_ = 0;
  local_88[0x30] = '\0';
  local_40._M_p = (pointer)&local_30;
  local_38 = 0;
  local_30._M_local_buf[0] = '\0';
  std::__cxx11::string::_M_assign((string *)local_88);
  local_88._64_8_ = generator;
  std::__cxx11::string::_M_assign((string *)&local_40);
  this_00 = absl::lts_20250127::container_internal::
            btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>>
            ::operator[]<std::__cxx11::string>
                      ((btree_map_container<absl::lts_20250127::container_internal::btree<absl::lts_20250127::container_internal::map_params<std::__cxx11::string,google::protobuf::compiler::CommandLineInterface::GeneratorInfo,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::compiler::CommandLineInterface::GeneratorInfo>>,256,false>>>
                        *)&this->generators_by_flag_name_,flag_name);
  GeneratorInfo::operator=(this_00,(GeneratorInfo *)local_88);
  GeneratorInfo::~GeneratorInfo((GeneratorInfo *)local_88);
  return;
}

Assistant:

void CommandLineInterface::RegisterGenerator(const std::string& flag_name,
                                             CodeGenerator* generator,
                                             const std::string& help_text) {
  GeneratorInfo info;
  info.flag_name = flag_name;
  info.generator = generator;
  info.help_text = help_text;
  generators_by_flag_name_[flag_name] = info;
}